

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall bpwriter::format_with_padding(bpwriter *this,char *str,fmtopts *opts)

{
  fmtopts *opts_00;
  size_t bytes_00;
  size_t in_RDX;
  long in_RSI;
  char *in_RDI;
  bpwriter *unaff_retaddr;
  size_t chars;
  utf8_ptr p;
  size_t bytes;
  utf8_ptr *in_stack_ffffffffffffffd0;
  char *str_00;
  
  str_00 = in_RDI;
  opts_00 = (fmtopts *)vmb_get_len((char *)0x300fe6);
  bytes_00 = in_RSI + 2;
  utf8_ptr::utf8_ptr(in_stack_ffffffffffffffd0,in_RDI);
  utf8_ptr::len(in_stack_ffffffffffffffd0,(size_t)in_RDI);
  format_with_padding(unaff_retaddr,str_00,bytes_00,in_RDX,opts_00);
  return;
}

Assistant:

void format_with_padding(VMG_ const char *str, const fmtopts &opts)
    {
        /* figure the byte length and get the buffer */
        size_t bytes = vmb_get_len(str);
        str += VMB_LEN;

        /* figure the character length */
        utf8_ptr p((char *)str);
        size_t chars = p.len(bytes);

        /* write it out */
        format_with_padding(vmg_ str, bytes, chars, opts);
    }